

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_micro.c
# Opt level: O0

void run_threads(uint n_threads,os_thread_t *threads,context *ctx)

{
  uint local_28;
  uint local_24;
  uint i_1;
  uint i;
  context *ctx_local;
  os_thread_t *threads_local;
  uint n_threads_local;
  
  for (local_24 = 0; local_24 < n_threads; local_24 = local_24 + 1) {
    os_thread_create(threads + local_24,(os_thread_attr_t *)0x0,ctx[local_24].worker,ctx + local_24)
    ;
  }
  for (local_28 = 0; local_28 < n_threads; local_28 = local_28 + 1) {
    os_thread_join(threads + local_28,(void **)0x0);
  }
  return;
}

Assistant:

static void
run_threads(unsigned n_threads, os_thread_t *threads, struct context *ctx)
{
	for (unsigned i = 0; i < n_threads; ++i)
		os_thread_create(&threads[i], NULL, ctx[i].worker,
					&ctx[i]);

	for (unsigned i = 0; i < n_threads; ++i)
		os_thread_join(&threads[i], NULL);
}